

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O2

int replay_display_objects(nh_objitem *items,int icount,char *title,int how,nh_objresult *pick_list)

{
  int iVar1;
  undefined8 in_RAX;
  char *pcVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  bool bVar6;
  int local_38;
  int id;
  
  lVar5 = 0;
  if (1 < how + 1U) {
    _local_38 = in_RAX;
    pcVar2 = next_log_token();
    if ((pcVar2 == (char *)0x0) || (*pcVar2 != 'o')) {
      parse_error("Bad object menu data");
    }
    if (pcVar2[2] == 'x') {
      lVar5 = -1;
    }
    else {
      pcVar2 = pcVar2 + 3;
      lVar5 = 0;
      while( true ) {
        _local_38 = CONCAT44(id,0xffffffff);
        iVar1 = __isoc99_sscanf(pcVar2,"%x,%x:",&id);
        if (iVar1 == 0) break;
        lVar3 = 0;
        bVar6 = false;
        piVar4 = &items->id;
        while ((lVar3 < icount && (!bVar6))) {
          iVar1 = *piVar4;
          lVar3 = lVar3 + 1;
          piVar4 = piVar4 + 0x49;
          bVar6 = iVar1 == id;
        }
        if (!bVar6) {
          parse_error("Invalid menu id in object menu data");
        }
        pick_list[lVar5].id = id;
        pick_list[lVar5].count = local_38;
        lVar5 = lVar5 + 1;
        pcVar2 = strchr(pcVar2,0x3a);
        pcVar2 = pcVar2 + 1;
      }
    }
  }
  return (int)lVar5;
}

Assistant:

static int replay_display_objects(struct nh_objitem *items, int icount, const char *title,
			int how, struct nh_objresult *pick_list)
{
    int i, j, id, count;
    char *token;
    char *resultbuf;
    boolean id_ok;
    
    if (how == PICK_NONE || how == PICK_INVACTION)
	return 0;
    
    token = next_log_token();
    if (!token || token[0] != 'o')
	parse_error("Bad object menu data");
    resultbuf = token + 2;
    
    if (*resultbuf++ == 'x')
	return -1;
    
    i = 0;
    count = -1;
    while (sscanf(resultbuf, "%x,%x:", &id, &count)) {
	/* make sure all ids are valid - program changes could have broken the save */
	id_ok  = FALSE;
	for (j = 0; j < icount && !id_ok; j++)
	    if (items[j].id == id)
		id_ok = TRUE;
	if (!id_ok)
	    parse_error("Invalid menu id in object menu data");
	
	pick_list[i].id = id;
	pick_list[i].count = count;
	i++;
	resultbuf = strchr(resultbuf, ':') + 1;
	count = -1;
    }

    return i;
}